

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Build_Map.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Build_Map::Build_Obstacle
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Build_Map *this,
          vector<double,_std::allocator<double>_> *v)

{
  initializer_list<int> __l;
  reference pvVar1;
  int *piVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  double dVar4;
  allocator<int> local_89;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  iterator local_70;
  size_type local_68;
  undefined1 local_5d;
  int local_5c;
  int local_58;
  int local_54;
  int maxz;
  int local_4c;
  int maxy;
  int local_44;
  int maxx;
  int local_3c;
  int local_38;
  int minz;
  int local_30;
  int local_2c;
  int miny;
  int local_24;
  vector<double,_std::allocator<double>_> *pvStack_20;
  int minx;
  vector<double,_std::allocator<double>_> *v_local;
  Build_Map *this_local;
  vector<int,_std::allocator<int>_> *Obstacle_Extrema;
  
  pvStack_20 = v;
  v_local = (vector<double,_std::allocator<double>_> *)this;
  this_local = (Build_Map *)__return_storage_ptr__;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](v,0);
  dVar4 = *pvVar1;
  this_00 = &this->Boundary;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
  dVar4 = floor(((dVar4 - *pvVar1) - this->margin) / this->xy_res);
  miny = (int)dVar4;
  local_2c = 0;
  piVar2 = std::max<int>(&miny,&local_2c);
  local_24 = *piVar2;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](v,1);
  dVar4 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_00,1);
  dVar4 = floor(((dVar4 - *pvVar1) - this->margin) / this->xy_res);
  minz = (int)dVar4;
  local_38 = 0;
  piVar2 = std::max<int>(&minz,&local_38);
  local_30 = *piVar2;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](v,2);
  dVar4 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_00,2);
  dVar4 = floor(((dVar4 - *pvVar1) - this->margin) / this->z_res);
  maxx = (int)dVar4;
  local_44 = 0;
  piVar2 = std::max<int>(&maxx,&local_44);
  local_3c = *piVar2;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](v,3);
  dVar4 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
  dVar4 = ceil(((dVar4 - *pvVar1) + this->margin) / this->xy_res);
  local_4c = (int)dVar4;
  this_01 = &this->World;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_01,0);
  piVar2 = std::min<int>(&local_4c,pvVar3);
  maxy = *piVar2;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](v,4);
  dVar4 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_00,1);
  dVar4 = ceil(((dVar4 - *pvVar1) + this->margin) / this->xy_res);
  local_54 = (int)dVar4;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_01,1);
  piVar2 = std::min<int>(&local_54,pvVar3);
  maxz = *piVar2;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](v,5);
  dVar4 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_00,2);
  dVar4 = ceil(((dVar4 - *pvVar1) + this->margin) / this->z_res);
  local_5c = (int)dVar4;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_01,2);
  piVar2 = std::min<int>(&local_5c,pvVar3);
  local_74 = *piVar2;
  local_5d = 0;
  local_88 = local_24;
  local_84 = local_30;
  local_80 = local_3c;
  local_7c = maxy;
  local_78 = maxz;
  local_70 = &local_88;
  local_68 = 6;
  local_58 = local_74;
  std::allocator<int>::allocator(&local_89);
  __l._M_len = local_68;
  __l._M_array = local_70;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__l,&local_89);
  std::allocator<int>::~allocator(&local_89);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Build_Map::Build_Obstacle(std::vector<double> v) {
  int minx = std::max(
      static_cast<int>(std::floor(((v[0] - Boundary[0] - margin) / xy_res))),
      0);
  int miny = std::max(
      static_cast<int>(std::floor(((v[1] - Boundary[1] - margin) / xy_res))),
      0);
  int minz = std::max(
      static_cast<int>(std::floor(((v[2] - Boundary[2] - margin) / z_res))), 0);
  int maxx = std::min(
      static_cast<int>(std::ceil(((v[3] - Boundary[0] + margin) / xy_res))),
      World[0]);
  int maxy = std::min(
      static_cast<int>(std::ceil(((v[4] - Boundary[1] + margin) / xy_res))),
      World[1]);
  int maxz = std::min(
      static_cast<int>(std::ceil(((v[5] - Boundary[2] + margin) / z_res))),
      World[2]);
  std::vector<int> Obstacle_Extrema = { minx, miny, minz, maxx, maxy, maxz };
  return Obstacle_Extrema;
}